

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O3

void __thiscall
ASDCP::MXF::TLVReader::TLVReader(TLVReader *this,byte_t *p,ui32_t c,IPrimerLookup *PrimerLookup)

{
  uint uVar1;
  uint uVar2;
  _Rb_tree_header *p_Var3;
  byte_t bVar4;
  byte_t bVar5;
  byte_t *pbVar6;
  ushort uVar7;
  uint uVar8;
  ILogSink *this_00;
  uint uVar9;
  Result_t result;
  int local_100 [26];
  pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_> local_98 [8];
  
  Kumu::MemIOReader::MemIOReader(&this->super_MemIOReader,p,c);
  p_Var3 = &(this->m_ElementMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_ElementMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_ElementMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_ElementMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->m_ElementMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->m_ElementMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_Lookup = PrimerLookup;
  Kumu::Result_t::Result_t((Result_t *)local_100,(Result_t *)&Kumu::RESULT_OK);
  uVar8 = (this->super_MemIOReader).m_capacity;
  uVar9 = (this->super_MemIOReader).m_size;
  if ((uVar8 != uVar9) && (-1 < local_100[0])) {
    do {
      uVar1 = uVar9 + 1;
      if (uVar8 < uVar1) {
LAB_001a1d14:
        this_00 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Error(this_00,"Malformed Set\n");
        std::
        _Rb_tree<ASDCP::TagValue,_std::pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<ASDCP::TagValue>,_std::allocator<std::pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_>_>_>
        ::clear(&(this->m_ElementMap)._M_t);
        Kumu::Result_t::operator()((int *)local_98,ASDCP::RESULT_KLV_CODING);
        Kumu::Result_t::operator=((Result_t *)local_100,(Result_t *)local_98);
        Kumu::Result_t::~Result_t((Result_t *)local_98);
        uVar8 = (this->super_MemIOReader).m_capacity;
        uVar9 = (this->super_MemIOReader).m_size;
      }
      else {
        pbVar6 = (this->super_MemIOReader).m_p;
        bVar4 = pbVar6[uVar9];
        (this->super_MemIOReader).m_size = uVar1;
        uVar2 = uVar9 + 2;
        if (uVar8 < uVar2) goto LAB_001a1d14;
        bVar5 = pbVar6[uVar1];
        (this->super_MemIOReader).m_size = uVar2;
        if ((ulong)uVar8 < (ulong)uVar2 + 2) goto LAB_001a1d14;
        uVar7 = *(ushort *)(pbVar6 + uVar2) << 8 | *(ushort *)(pbVar6 + uVar2) >> 8;
        local_98[0].second.first = uVar9 + 4;
        (this->super_MemIOReader).m_size = local_98[0].second.first;
        local_98[0].first.b = bVar5;
        local_98[0].first.a = bVar4;
        local_98[0].second.second._0_2_ = uVar7;
        local_98[0].second.second._2_2_ = 0;
        std::
        _Rb_tree<ASDCP::TagValue,std::pair<ASDCP::TagValue_const,std::pair<unsigned_int,unsigned_int>>,std::_Select1st<std::pair<ASDCP::TagValue_const,std::pair<unsigned_int,unsigned_int>>>,std::less<ASDCP::TagValue>,std::allocator<std::pair<ASDCP::TagValue_const,std::pair<unsigned_int,unsigned_int>>>>
        ::_M_insert_unique<std::pair<ASDCP::TagValue_const,std::pair<unsigned_int,unsigned_int>>>
                  ((_Rb_tree<ASDCP::TagValue,std::pair<ASDCP::TagValue_const,std::pair<unsigned_int,unsigned_int>>,std::_Select1st<std::pair<ASDCP::TagValue_const,std::pair<unsigned_int,unsigned_int>>>,std::less<ASDCP::TagValue>,std::allocator<std::pair<ASDCP::TagValue_const,std::pair<unsigned_int,unsigned_int>>>>
                    *)&this->m_ElementMap,local_98);
        uVar9 = (uint)uVar7 + (this->super_MemIOReader).m_size;
        uVar8 = (this->super_MemIOReader).m_capacity;
        if (uVar8 < uVar9) goto LAB_001a1d14;
        (this->super_MemIOReader).m_size = uVar9;
      }
    } while ((uVar8 != uVar9) && (-1 < local_100[0]));
  }
  Kumu::Result_t::~Result_t((Result_t *)local_100);
  return;
}

Assistant:

ASDCP::MXF::TLVReader::TLVReader(const byte_t* p, ui32_t c, IPrimerLookup* PrimerLookup) :
  MemIOReader(p, c), m_Lookup(PrimerLookup)
{
  Result_t result = RESULT_OK;

  while ( Remainder() > 0 && ASDCP_SUCCESS(result) )
    {
      TagValue Tag;
      ui16_t pkt_len = 0;

      if ( MemIOReader::ReadUi8(&Tag.a) )
	if ( MemIOReader::ReadUi8(&Tag.b) )
	  if ( MemIOReader::ReadUi16BE(&pkt_len) )
	    {
	      m_ElementMap.insert(TagMap::value_type(Tag, ItemInfo(m_size, pkt_len)));
	      if ( SkipOffset(pkt_len) )
		continue;;
	    }

      DefaultLogSink().Error("Malformed Set\n");
      m_ElementMap.clear();
      result = RESULT_KLV_CODING(__LINE__, __FILE__);
    }
}